

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode override_login(Curl_easy *data,connectdata *conn)

{
  char **ppcVar1;
  char **ppcVar2;
  char **passwordp;
  undefined1 *puVar3;
  CURLcode CVar4;
  CURLUcode CVar5;
  int iVar6;
  char *pcVar7;
  char **ppcVar8;
  
  if ((data->set).str[0x2c] == (char *)0x0) {
LAB_0053aa4f:
    ppcVar2 = &conn->user;
    passwordp = &conn->passwd;
    if ((data->set).use_netrc == '\x02') {
      (*Curl_cfree)(*ppcVar2);
      *ppcVar2 = (char *)0x0;
      (*Curl_cfree)(*passwordp);
      *passwordp = (char *)0x0;
    }
    puVar3 = &(conn->bits).field_0x6;
    *puVar3 = *puVar3 & 0xbf;
    ppcVar8 = ppcVar2;
    if (((data->set).use_netrc == '\0') || ((data->set).str[0x2a] != (char *)0x0)) {
      pcVar7 = *ppcVar2;
      if (pcVar7 != (char *)0x0) goto LAB_0053aaae;
    }
    else {
      ppcVar1 = &(data->state).aptr.user;
      pcVar7 = (data->state).aptr.user;
      ppcVar8 = ppcVar1;
      if (pcVar7 == (char *)0x0) {
        ppcVar8 = ppcVar2;
      }
      iVar6 = Curl_parsenetrc((conn->host).name,ppcVar8,passwordp,(data->set).str[0x14]);
      if (iVar6 < 1) {
        if (iVar6 < 0) {
          Curl_failf(data,".netrc parser error");
          return CURLE_READ_ERROR;
        }
        puVar3 = &(conn->bits).field_0x6;
        *puVar3 = *puVar3 | 0x40;
      }
      else {
        Curl_infof(data,"Couldn\'t find host %s in the %s file; using defaults",(conn->host).name,
                   (data->set).str[0x14]);
      }
      if (pcVar7 != (char *)0x0) {
        (*Curl_cfree)(*ppcVar2);
        *ppcVar2 = (char *)0x0;
        pcVar7 = (*Curl_cstrdup)(*ppcVar1);
        *ppcVar2 = pcVar7;
        if (pcVar7 == (char *)0x0) goto switchD_0053ab07_caseD_7;
      }
      pcVar7 = *ppcVar8;
      if (pcVar7 == (char *)0x0) {
        if (*passwordp == (char *)0x0) goto LAB_0053aac7;
        pcVar7 = (*Curl_cstrdup)("");
        *ppcVar8 = pcVar7;
        if (pcVar7 == (char *)0x0) goto switchD_0053ab07_caseD_7;
      }
LAB_0053aaae:
      if (((data->state).aptr.user != pcVar7) &&
         (CVar4 = Curl_setstropt(&(data->state).aptr.user,pcVar7), CVar4 != CURLE_OK)) {
        return CVar4;
      }
    }
LAB_0053aac7:
    pcVar7 = (data->state).aptr.user;
    if (pcVar7 != (char *)0x0) {
      CVar5 = curl_url_set((data->state).uh,CURLUPART_USER,pcVar7,0x80);
      CVar4 = CURLE_URL_MALFORMAT;
      switch(CVar5) {
      case CURLUE_OK:
        if (*ppcVar8 == (char *)0x0) {
          pcVar7 = (*Curl_cstrdup)((data->state).aptr.user);
          *ppcVar8 = pcVar7;
          if (pcVar7 == (char *)0x0) goto switchD_0053ab07_caseD_7;
        }
        break;
      default:
        goto switchD_0053ab07_caseD_1;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_0053ab07_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_0053ab07_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_0053ab07_caseD_8;
      }
    }
    if ((*passwordp != (char *)0x0) &&
       (CVar4 = Curl_setstropt(&(data->state).aptr.passwd,*passwordp), CVar4 != CURLE_OK)) {
      return CVar4;
    }
    pcVar7 = (data->state).aptr.passwd;
    if (pcVar7 != (char *)0x0) {
      CVar4 = CURLE_URL_MALFORMAT;
      CVar5 = curl_url_set((data->state).uh,CURLUPART_PASSWORD,pcVar7,0x80);
      switch(CVar5) {
      case CURLUE_OK:
        if (*passwordp == (char *)0x0) {
          pcVar7 = (*Curl_cstrdup)((data->state).aptr.passwd);
          *passwordp = pcVar7;
          if (pcVar7 == (char *)0x0) goto switchD_0053ab07_caseD_7;
        }
        break;
      default:
        goto switchD_0053ab07_caseD_1;
      case CURLUE_UNSUPPORTED_SCHEME:
switchD_0053ab07_caseD_5:
        return CURLE_UNSUPPORTED_PROTOCOL;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_0053ab07_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
switchD_0053ab07_caseD_8:
        return CURLE_LOGIN_DENIED;
      }
    }
    CVar4 = CURLE_OK;
  }
  else {
    (*Curl_cfree)(conn->options);
    pcVar7 = (*Curl_cstrdup)((data->set).str[0x2c]);
    conn->options = pcVar7;
    if (pcVar7 != (char *)0x0) goto LAB_0053aa4f;
switchD_0053ab07_caseD_7:
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
switchD_0053ab07_caseD_1:
  return CVar4;
}

Assistant:

static CURLcode override_login(struct Curl_easy *data,
                               struct connectdata *conn)
{
  CURLUcode uc;
  char **userp = &conn->user;
  char **passwdp = &conn->passwd;
  char **optionsp = &conn->options;

  if(data->set.str[STRING_OPTIONS]) {
    free(*optionsp);
    *optionsp = strdup(data->set.str[STRING_OPTIONS]);
    if(!*optionsp)
      return CURLE_OUT_OF_MEMORY;
  }

#ifndef CURL_DISABLE_NETRC
  if(data->set.use_netrc == CURL_NETRC_REQUIRED) {
    Curl_safefree(*userp);
    Curl_safefree(*passwdp);
  }
  conn->bits.netrc = FALSE;
  if(data->set.use_netrc && !data->set.str[STRING_USERNAME]) {
    int ret;
    bool url_provided = FALSE;

    if(data->state.aptr.user) {
      /* there was a user name in the URL. Use the URL decoded version */
      userp = &data->state.aptr.user;
      url_provided = TRUE;
    }

    ret = Curl_parsenetrc(conn->host.name,
                          userp, passwdp,
                          data->set.str[STRING_NETRC_FILE]);
    if(ret > 0) {
      infof(data, "Couldn't find host %s in the %s file; using defaults",
            conn->host.name, data->set.str[STRING_NETRC_FILE]);
    }
    else if(ret < 0) {
      failf(data, ".netrc parser error");
      return CURLE_READ_ERROR;
    }
    else {
      /* set bits.netrc TRUE to remember that we got the name from a .netrc
         file, so that it is safe to use even if we followed a Location: to a
         different host or similar. */
      conn->bits.netrc = TRUE;
    }
    if(url_provided) {
      Curl_safefree(conn->user);
      conn->user = strdup(*userp);
      if(!conn->user)
        return CURLE_OUT_OF_MEMORY;
    }
    /* no user was set but a password, set a blank user */
    if(userp && !*userp && *passwdp) {
      *userp = strdup("");
      if(!*userp)
        return CURLE_OUT_OF_MEMORY;
    }
  }
#endif

  /* for updated strings, we update them in the URL */
  if(*userp) {
    CURLcode result;
    if(data->state.aptr.user != *userp) {
      /* nothing to do then */
      result = Curl_setstropt(&data->state.aptr.user, *userp);
      if(result)
        return result;
    }
  }
  if(data->state.aptr.user) {
    uc = curl_url_set(data->state.uh, CURLUPART_USER, data->state.aptr.user,
                      CURLU_URLENCODE);
    if(uc)
      return Curl_uc_to_curlcode(uc);
    if(!*userp) {
      *userp = strdup(data->state.aptr.user);
      if(!*userp)
        return CURLE_OUT_OF_MEMORY;
    }
  }
  if(*passwdp) {
    CURLcode result = Curl_setstropt(&data->state.aptr.passwd, *passwdp);
    if(result)
      return result;
  }
  if(data->state.aptr.passwd) {
    uc = curl_url_set(data->state.uh, CURLUPART_PASSWORD,
                      data->state.aptr.passwd, CURLU_URLENCODE);
    if(uc)
      return Curl_uc_to_curlcode(uc);
    if(!*passwdp) {
      *passwdp = strdup(data->state.aptr.passwd);
      if(!*passwdp)
        return CURLE_OUT_OF_MEMORY;
    }
  }

  return CURLE_OK;
}